

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_frame_short_interleaved(stb_vorbis *f,int num_c,short *buffer,int num_shorts)

{
  int in_ECX;
  short **in_RDX;
  int in_ESI;
  stb_vorbis *in_RDI;
  int len;
  float **output;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ESI == 1) {
    local_34 = stb_vorbis_get_frame_short(in_RDI,1,in_RDX,in_ECX);
  }
  else {
    local_34 = stb_vorbis_get_frame_float
                         ((stb_vorbis *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int *)in_RDX,
                          (float ***)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    if (local_34 != 0) {
      if (in_ECX < local_34 * in_ESI) {
        local_34 = in_ECX / in_ESI;
      }
      convert_channels_short_interleaved
                (len,(short *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int)((ulong)in_RDI >> 0x20),(float **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    }
  }
  return local_34;
}

Assistant:

int stb_vorbis_get_frame_short_interleaved(stb_vorbis *f, int num_c, short *buffer, int num_shorts)
{
   float **output;
   int len;
   if (num_c == 1) return stb_vorbis_get_frame_short(f,num_c,&buffer, num_shorts);
   len = stb_vorbis_get_frame_float(f, NULL, &output);
   if (len) {
      if (len*num_c > num_shorts) len = num_shorts / num_c;
      convert_channels_short_interleaved(num_c, buffer, f->channels, output, 0, len);
   }
   return len;
}